

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.hpp
# Opt level: O2

Ptr<Buffer> __thiscall
myvk::Buffer::
CreateStaging<__gnu_cxx::__normal_iterator<Vertex*,std::vector<Vertex,std::allocator<Vertex>>>>
          (Buffer *this,Ptr<Device> *device,
          __normal_iterator<Vertex_*,_std::vector<Vertex,_std::allocator<Vertex>_>_> begin,
          __normal_iterator<Vertex_*,_std::vector<Vertex,_std::allocator<Vertex>_>_> end,
          vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
          *access_queues)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr<Buffer> PVar1;
  
  Create(this,device,(long)end._M_current - (long)begin._M_current,0x404,1,VMA_MEMORY_USAGE_AUTO,
         access_queues);
  UpdateData<__gnu_cxx::__normal_iterator<Vertex*,std::vector<Vertex,std::allocator<Vertex>>>>
            ((Buffer *)(this->super_BufferBase).super_DeviceObjectBase.super_Base._vptr_Base,begin,
             end,0);
  PVar1.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar1.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr<Buffer>)PVar1.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Ptr<Buffer> CreateStaging(const Ptr<Device> &device, Iter begin, Iter end,
	                                 const std::vector<Ptr<Queue>> &access_queues = {}) {
		using T = typename std::iterator_traits<Iter>::value_type;
		Ptr<Buffer> ret =
		    Create(device, (end - begin) * sizeof(T),
		           VMA_ALLOCATION_CREATE_MAPPED_BIT | VMA_ALLOCATION_CREATE_HOST_ACCESS_SEQUENTIAL_WRITE_BIT,
		           VK_BUFFER_USAGE_TRANSFER_SRC_BIT, VMA_MEMORY_USAGE_AUTO, access_queues);
		ret->UpdateData(begin, end, 0);
		return ret;
	}